

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Vector4D * __thiscall CMU462::Matrix4x4::operator*(Matrix4x4 *this,Vector4D *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Vector4D *in_RDI;
  
  dVar1 = x->x;
  dVar2 = this->entries[0].y;
  dVar3 = this->entries[0].z;
  dVar4 = this->entries[0].w;
  dVar5 = x->y;
  dVar6 = this->entries[1].y;
  dVar7 = this->entries[1].z;
  dVar8 = this->entries[1].w;
  dVar9 = x->z;
  dVar10 = this->entries[2].y;
  dVar11 = this->entries[2].z;
  dVar12 = this->entries[2].w;
  dVar13 = x->w;
  dVar14 = this->entries[3].y;
  dVar15 = this->entries[3].z;
  dVar16 = this->entries[3].w;
  in_RDI->x = this->entries[3].x * dVar13 +
              this->entries[2].x * dVar9 + this->entries[1].x * dVar5 + this->entries[0].x * dVar1;
  in_RDI->y = dVar14 * dVar13 + dVar10 * dVar9 + dVar6 * dVar5 + dVar2 * dVar1;
  in_RDI->z = dVar15 * dVar13 + dVar11 * dVar9 + dVar7 * dVar5 + dVar3 * dVar1;
  in_RDI->w = dVar13 * dVar16 + dVar9 * dVar12 + dVar5 * dVar8 + dVar1 * dVar4;
  return in_RDI;
}

Assistant:

Vector4D Matrix4x4::operator*( const Vector4D& x ) const {
    return x[0]*entries[0] + // Add up products for each matrix column.
           x[1]*entries[1] +
           x[2]*entries[2] +
           x[3]*entries[3];
  }